

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int firstch(parse *p,cset *cs)

{
  size_t css;
  size_t i;
  cset *cs_local;
  parse *p_local;
  
  css = 0;
  while( true ) {
    if ((ulong)(long)p->g->csetsize <= css) {
      if (never != 0) {
        return 0;
      }
      __assert_fail("never",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x4e7,"int firstch()");
    }
    if ((cs->ptr[css & 0xff] & cs->mask) != 0) break;
    css = css + 1;
  }
  return (int)(char)css;
}

Assistant:

static int			/* character; there is no "none" value */
firstch(p, cs)
struct parse *p;
cset *cs;
{
	size_t i;
	size_t css = (size_t)p->g->csetsize;

	for (i = 0; i < css; i++)
		if (CHIN(cs, i))
			return((char)i);
	assert(never);
	return(0);		/* arbitrary */
}